

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O0

void __thiscall
SerialExecutionQueue::executeProcess
          (SerialExecutionQueue *this,QueueJobContext *opaqueContext,
          ArrayRef<llvm::StringRef> commandLine,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment,
          ProcessAttributes attributes,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn,
          ProcessDelegate *delegate)

{
  ProcessResult __args;
  ArrayRef<llvm::StringRef> commandLine_00;
  StringRef value;
  StringRef key;
  bool bVar1;
  function<void_(llbuild::basic::ProcessResult)> *this_00;
  undefined8 uVar2;
  iterator ppVar3;
  ProcessContext *ctx;
  ProcessDelegate *local_400;
  size_t local_3f8;
  POSIXEnvironment local_378;
  StringRef *local_308;
  size_type local_300;
  ProcessHandle local_2f8;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> local_2f0;
  undefined1 local_2c8 [8];
  ProcessCompletionFn laneCompletionFn;
  undefined1 local_2a0 [8];
  ProcessReleaseFn releaseFn;
  ProcessHandle handle;
  StringRef local_258;
  undefined1 local_248 [8];
  pair<llvm::StringRef,_llvm::StringRef> pair;
  char **p;
  pair<llvm::StringRef,_llvm::StringRef> *entry;
  iterator __end1;
  iterator __begin1;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *__range1;
  string local_1c8;
  StringRef local_1a8;
  StringRef local_198;
  Twine local_188;
  string local_170;
  StringRef local_150;
  StringRef local_140;
  undefined1 local_130 [8];
  POSIXEnvironment posixEnv;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  uint64_t local_a0;
  SerialContext *context;
  QueueJobContext *opaqueContext_local;
  SerialExecutionQueue *this_local;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment_local;
  ArrayRef<llvm::StringRef> commandLine_local;
  
  environment_local.Data = (pair<llvm::StringRef,_llvm::StringRef> *)environment.Length;
  this_local = (SerialExecutionQueue *)environment.Data;
  environment_local.Length = (size_type)commandLine.Data;
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->cancelled);
  if (bVar1) {
    bVar1 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::hasValue
                      (completionFn);
    if (bVar1) {
      this_00 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getValue
                          (completionFn);
      llbuild::basic::ProcessResult::makeCancelled((ProcessResult *)&posixEnv.isFrozen,-1);
      __args._8_8_ = uStack_b8;
      __args._0_8_ = posixEnv._104_8_;
      __args.utime = local_b0;
      __args.stime = uStack_a8;
      __args.maxrss = local_a0;
      std::function<void_(llbuild::basic::ProcessResult)>::operator()(this_00,__args);
    }
  }
  else {
    llbuild::basic::POSIXEnvironment::POSIXEnvironment((POSIXEnvironment *)local_130);
    strlen("LLBUILD_BUILD_ID");
    llvm::Twine::Twine(&local_188,this->buildID);
    llvm::Twine::str_abi_cxx11_(&local_170,&local_188);
    uVar2 = std::__cxx11::string::data();
    local_150.Data = (char *)uVar2;
    uVar2 = std::__cxx11::string::length();
    local_150.Length = uVar2;
    llbuild::basic::POSIXEnvironment::setIfMissing
              ((POSIXEnvironment *)local_130,local_140,local_150);
    std::__cxx11::string::~string((string *)&local_170);
    strlen("LLBUILD_LANE_ID");
    llvm::Twine::Twine((Twine *)&__range1,0);
    llvm::Twine::str_abi_cxx11_(&local_1c8,(Twine *)&__range1);
    uVar2 = std::__cxx11::string::data();
    local_1a8.Data = (char *)uVar2;
    uVar2 = std::__cxx11::string::length();
    local_1a8.Length = uVar2;
    llbuild::basic::POSIXEnvironment::setIfMissing
              ((POSIXEnvironment *)local_130,local_198,local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    __end1 = llvm::ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>::begin
                       ((ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *)&this_local);
    ppVar3 = llvm::ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>::end
                       ((ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *)&this_local);
    for (; __end1 != ppVar3; __end1 = __end1 + 1) {
      llbuild::basic::POSIXEnvironment::setIfMissing
                ((POSIXEnvironment *)local_130,__end1->first,__end1->second);
    }
    if (((undefined1  [32])attributes & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
      for (pair.second.Length = (size_t)this->environment; *(long *)pair.second.Length != 0;
          pair.second.Length = pair.second.Length + 8) {
        local_258.Data = *(char **)pair.second.Length;
        if (local_258.Data == (char *)0x0) {
          local_3f8 = 0;
        }
        else {
          local_3f8 = strlen(local_258.Data);
        }
        local_258.Length = local_3f8;
        llvm::StringRef::split((pair<llvm::StringRef,_llvm::StringRef> *)local_248,&local_258,'=');
        key.Length = (size_t)pair.first.Data;
        key.Data = (char *)local_248;
        value.Length = (size_t)pair.second.Data;
        value.Data = (char *)pair.first.Length;
        llbuild::basic::POSIXEnvironment::setIfMissing((POSIXEnvironment *)local_130,key,value);
      }
    }
    releaseFn._M_invoker = (_Invoker_type)opaqueContext[1]._vptr_QueueJobContext;
    std::function<void(std::function<void()>&&)>::
    function<SerialExecutionQueue::executeProcess(llbuild::basic::QueueJobContext*,llvm::ArrayRef<llvm::StringRef>,llvm::ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>>,llbuild::basic::ProcessAttributes,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>,llbuild::basic::ProcessDelegate*)::_lambda(std::function<void()>&&)_1_,void>
              ((function<void(std::function<void()>&&)> *)local_2a0,
               (anon_class_1_0_00000001 *)((long)&laneCompletionFn._M_invoker + 7));
    llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::Optional
              (&local_2f0,completionFn);
    std::function<void(llbuild::basic::ProcessResult)>::
    function<SerialExecutionQueue::executeProcess(llbuild::basic::QueueJobContext*,llvm::ArrayRef<llvm::StringRef>,llvm::ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>>,llbuild::basic::ProcessAttributes,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>,llbuild::basic::ProcessDelegate*)::_lambda(llbuild::basic::ProcessResult)_1_,void>
              ((function<void(llbuild::basic::ProcessResult)> *)local_2c8,
               (anon_class_40_1_0860c3c2 *)&local_2f0);
    executeProcess(llbuild::basic::QueueJobContext*,llvm::ArrayRef<llvm::StringRef>,llvm::ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>>,llbuild::basic::ProcessAttributes,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>,llbuild::basic::ProcessDelegate*)
    ::{lambda(llbuild::basic::ProcessResult)#1}::~ProcessDelegate
              ((_lambda_llbuild__basic__ProcessResult__1_ *)&local_2f0);
    if (delegate == (ProcessDelegate *)0x0) {
      local_400 = &llbuild::basic::ExecutionQueue::getDelegate(&this->super_ExecutionQueue)->
                   super_ProcessDelegate;
    }
    else {
      local_400 = delegate;
    }
    ctx = (ProcessContext *)
          llbuild::basic::QueueJob::getDescriptor
                    ((QueueJob *)opaqueContext[2]._vptr_QueueJobContext);
    local_2f8.id = (uint64_t)releaseFn._M_invoker;
    local_308 = (StringRef *)environment_local.Length;
    local_300 = commandLine.Length;
    llbuild::basic::POSIXEnvironment::POSIXEnvironment(&local_378,(POSIXEnvironment *)local_130);
    commandLine_00.Length = local_300;
    commandLine_00.Data = local_308;
    llbuild::basic::spawnProcess
              (local_400,ctx,&this->spawnedProcesses,local_2f8,commandLine_00,&local_378,attributes,
               (ProcessReleaseFn *)local_2a0,(ProcessCompletionFn *)local_2c8);
    llbuild::basic::POSIXEnvironment::~POSIXEnvironment(&local_378);
    std::function<void_(llbuild::basic::ProcessResult)>::~function
              ((function<void_(llbuild::basic::ProcessResult)> *)local_2c8);
    std::function<void_(std::function<void_()>_&&)>::~function
              ((function<void_(std::function<void_()>_&&)> *)local_2a0);
    llbuild::basic::POSIXEnvironment::~POSIXEnvironment((POSIXEnvironment *)local_130);
  }
  return;
}

Assistant:

virtual void executeProcess(
      QueueJobContext* opaqueContext,
      ArrayRef<StringRef> commandLine,
      ArrayRef<std::pair<StringRef, StringRef>> environment,
      ProcessAttributes attributes,
      llvm::Optional<ProcessCompletionFn> completionFn,
      ProcessDelegate* delegate
  ) override {

    SerialContext& context = *reinterpret_cast<SerialContext*>(opaqueContext);

    // Do not execute new processes anymore after cancellation.
    if (cancelled) {
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessResult::makeCancelled());
      return;
    }

    // Form the complete environment.
    //
    // NOTE: We construct the environment in order of precedence, so
    // overridden keys should be defined first.
    POSIXEnvironment posixEnv;

    // Export lane ID to subprocesses.
    posixEnv.setIfMissing("LLBUILD_BUILD_ID", Twine(buildID).str());
    posixEnv.setIfMissing("LLBUILD_LANE_ID", Twine(0).str());

    // Add the requested environment.
    for (const auto& entry: environment) {
      posixEnv.setIfMissing(entry.first, entry.second);
    }

    // Inherit the base environment, if desired.
    //
    // FIXME: This involves a lot of redundant allocation, currently. We could
    // cache this for the common case of a directly inherited environment.
    if (attributes.inheritEnvironment) {
      for (const char* const* p = this->environment; *p != nullptr; ++p) {
        auto pair = StringRef(*p).split('=');
        posixEnv.setIfMissing(pair.first, pair.second);
      }
    }

    // Assign a process handle, which just needs to be unique for as long as we
    // are communicating with the delegate.
    ProcessHandle handle;
    handle.id = context.jobID;

    ProcessReleaseFn releaseFn = [](std::function<void()>&& processWait) {
      // not allowed to release, call wait directly
      processWait();
    };

    ProcessCompletionFn laneCompletionFn{
      [completionFn](ProcessResult result) mutable {
        if (completionFn.hasValue())
          completionFn.getValue()(result);
      }
    };

    spawnProcess(
        delegate ? *delegate : getDelegate(),
        reinterpret_cast<ProcessContext*>(context.job.getDescriptor()),
        spawnedProcesses,
        handle,
        commandLine,
        posixEnv,
        attributes,
        std::move(releaseFn),
        std::move(laneCompletionFn)
    );
  }